

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int ASN1_STRING_print(BIO *bp,ASN1_STRING *v)

{
  uchar *puVar1;
  int iVar2;
  char *p;
  char buf [80];
  int n;
  int i;
  ASN1_STRING *v_local;
  BIO *bp_local;
  
  if (v == (ASN1_STRING *)0x0) {
    bp_local._4_4_ = 0;
  }
  else {
    buf[0x48] = '\0';
    buf[0x49] = '\0';
    buf[0x4a] = '\0';
    buf[0x4b] = '\0';
    puVar1 = v->data;
    buf[0x4c] = '\0';
    buf[0x4d] = '\0';
    buf[0x4e] = '\0';
    buf[0x4f] = '\0';
    for (; (int)buf._76_4_ < v->length; buf._76_4_ = buf._76_4_ + 1) {
      if (((char)puVar1[(int)buf._76_4_] < '\x7f') &&
         ((('\x1f' < (char)puVar1[(int)buf._76_4_] || (puVar1[(int)buf._76_4_] == '\n')) ||
          (puVar1[(int)buf._76_4_] == '\r')))) {
        buf[(long)(int)buf._72_4_ + -8] = puVar1[(int)buf._76_4_];
      }
      else {
        buf[(long)(int)buf._72_4_ + -8] = '.';
      }
      buf._72_4_ = buf._72_4_ + 1;
      if (0x4f < (int)buf._72_4_) {
        iVar2 = BIO_write(bp,&p,buf._72_4_);
        if (iVar2 < 1) {
          return 0;
        }
        buf[0x48] = '\0';
        buf[0x49] = '\0';
        buf[0x4a] = '\0';
        buf[0x4b] = '\0';
      }
    }
    if (((int)buf._72_4_ < 1) || (iVar2 = BIO_write(bp,&p,buf._72_4_), 0 < iVar2)) {
      bp_local._4_4_ = 1;
    }
    else {
      bp_local._4_4_ = 0;
    }
  }
  return bp_local._4_4_;
}

Assistant:

int ASN1_STRING_print(BIO *bp, const ASN1_STRING *v) {
  int i, n;
  char buf[80];
  const char *p;

  if (v == NULL) {
    return 0;
  }
  n = 0;
  p = (const char *)v->data;
  for (i = 0; i < v->length; i++) {
    if ((p[i] > '~') || ((p[i] < ' ') && (p[i] != '\n') && (p[i] != '\r'))) {
      buf[n] = '.';
    } else {
      buf[n] = p[i];
    }
    n++;
    if (n >= 80) {
      if (BIO_write(bp, buf, n) <= 0) {
        return 0;
      }
      n = 0;
    }
  }
  if (n > 0) {
    if (BIO_write(bp, buf, n) <= 0) {
      return 0;
    }
  }
  return 1;
}